

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::detail::format_error_code(buffer<char> *out,int error_code,string_view message)

{
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  undefined1 uVar1;
  int iVar2;
  make_unsigned_t<int> mVar3;
  size_t sVar4;
  uint32_t in_ESI;
  buffer<char> *in_RDI;
  basic_string_view<char> bVar5;
  appender it;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  int ignore;
  string_view sv;
  int ignore_1;
  string_view sv_1;
  size_t in_stack_fffffffffffffd98;
  buffer<char> *in_stack_fffffffffffffda0;
  remove_cvref_t<fmt::v11::basic_appender<char>_&> in_stack_fffffffffffffdb0;
  basic_string_view<char> *in_stack_fffffffffffffdb8;
  basic_appender<char> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined2 in_stack_fffffffffffffdec;
  bool in_stack_fffffffffffffdef;
  char *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  char *local_200;
  size_t local_1f8;
  buffer<char> *local_1f0;
  undefined1 local_1e1;
  basic_appender<char> *local_1e0;
  size_t local_1d8;
  value<fmt::v11::context> local_1d0;
  long local_1c0;
  uint32_t local_1b4;
  buffer<char> *local_1b0;
  basic_string_view<char> local_1a8;
  undefined1 local_198 [16];
  char *local_188 [2];
  undefined8 local_178;
  undefined1 *local_170;
  basic_appender<char> *local_168;
  size_t sStack_160;
  char *local_158;
  basic_string_view<char> *local_150;
  value<fmt::v11::context> *local_148;
  basic_appender<char> *local_140;
  size_t sStack_138;
  buffer<char> *local_130;
  int local_124;
  char *local_120;
  undefined8 local_118;
  undefined1 *local_108;
  basic_appender<char> **local_100;
  char *local_f8 [2];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  char **local_d0;
  char *local_c8;
  size_t sStack_c0;
  uint32_t *local_b0;
  char *local_a8;
  value<fmt::v11::context> *local_a0;
  char *local_98;
  size_t sStack_90;
  buffer<char> *local_88;
  int local_7c;
  char *local_78;
  undefined8 local_70;
  undefined1 *local_60;
  char **local_58;
  undefined1 *local_48;
  char *local_40;
  char **local_38;
  char *local_30;
  char **local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  char **local_10;
  undefined8 *local_8;
  
  local_1b4 = in_ESI;
  local_1b0 = in_RDI;
  buffer<char>::try_resize(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  local_1c0 = 8;
  local_1d0.field_0.int128_value._12_4_ = local_1b4;
  uVar1 = is_negative<int,_0>(local_1b4);
  if ((bool)uVar1) {
    local_1d0.field_0.int128_value._12_4_ = -local_1d0.field_0.int128_value._12_4_;
    local_1c0 = local_1c0 + 1;
  }
  iVar2 = count_digits(local_1d0.field_0.uint128_value._12_4_);
  mVar3 = to_unsigned<int>(0);
  local_1c0 = local_1c0 + (ulong)mVar3;
  basic_appender<char>::basic_appender((basic_appender<char> *)&local_1d0,local_1b0);
  sVar4 = basic_string_view<char>::size(&local_1a8);
  if (sVar4 <= 500U - local_1c0) {
    format_error_code::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)in_stack_fffffffffffffdb0.container);
    local_100 = &local_1e0;
    local_108 = &local_1e1;
    bVar5 = v11::operator()((FMT_COMPILE_STRING *)0x61f912);
    in_stack_fffffffffffffdd8 = (basic_appender<char> *)bVar5.data_;
    local_1d8 = bVar5.size_;
    local_120 = "{}{}";
    local_118 = 4;
    local_124 = 0;
    local_1e0 = in_stack_fffffffffffffdd8;
    ignore_unused<int>(&local_124);
    local_140 = local_1e0;
    sStack_138 = local_1d8;
    local_148 = &local_1d0;
    local_150 = &local_1a8;
    local_158 = ": ";
    local_168 = local_1e0;
    sStack_160 = local_1d8;
    value<fmt::v11::context>::value<fmt::v11::basic_string_view<char>,_char,_0>
              (local_148,in_stack_fffffffffffffdb8);
    local_28 = local_188;
    local_30 = local_158;
    local_188[0] = local_158;
    local_18 = &local_178;
    local_20 = local_198;
    local_178 = 0xcd;
    fmt.size_ = in_stack_fffffffffffffdf8;
    fmt.data_ = in_stack_fffffffffffffdf0;
    args.desc_._4_4_ = mVar3;
    args.desc_._0_4_ = in_stack_fffffffffffffde0;
    args.field_1._0_4_ = iVar2;
    args.field_1._4_2_ = in_stack_fffffffffffffdec;
    args.field_1._6_1_ = uVar1;
    args.field_1._7_1_ = in_stack_fffffffffffffdef;
    local_170 = local_20;
    in_stack_fffffffffffffdb0 =
         vformat_to<fmt::v11::basic_appender<char>_&,_0>(in_stack_fffffffffffffdd8,fmt,args);
    local_1f0 = in_stack_fffffffffffffdb0.container;
    local_130 = in_stack_fffffffffffffdb0.container;
  }
  format_error_code::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)in_stack_fffffffffffffdb0.container);
  local_58 = &local_200;
  local_60 = &stack0xfffffffffffffdff;
  bVar5 = v11::operator()((FMT_COMPILE_STRING *)0x61faf0);
  local_1f8 = bVar5.size_;
  local_200 = bVar5.data_;
  local_78 = "{}{}";
  local_70 = 4;
  local_7c = 0;
  ignore_unused<int>(&local_7c);
  local_98 = local_200;
  sStack_90 = local_1f8;
  local_a0 = &local_1d0;
  local_a8 = "error ";
  local_b0 = &local_1b4;
  local_c8 = local_200;
  sStack_c0 = local_1f8;
  local_38 = local_f8;
  local_40 = "error ";
  local_f8[0] = "error ";
  local_48 = local_e8;
  local_8 = &local_d8;
  local_d8 = 0x1c;
  fmt_00.size_ = in_stack_fffffffffffffdf8;
  fmt_00.data_ = in_stack_fffffffffffffdf0;
  args_00.desc_._4_4_ = mVar3;
  args_00.desc_._0_4_ = in_stack_fffffffffffffde0;
  args_00.field_1._0_4_ = iVar2;
  args_00.field_1._4_2_ = in_stack_fffffffffffffdec;
  args_00.field_1._6_1_ = uVar1;
  args_00.field_1._7_1_ = in_stack_fffffffffffffdef;
  local_10 = local_38;
  local_d0 = local_38;
  local_88 = (buffer<char> *)
             vformat_to<fmt::v11::basic_appender<char>_&,_0>
                       (in_stack_fffffffffffffdd8,fmt_00,args_00);
  buffer<char>::size(local_1b0);
  ignore_unused<bool,char[1]>((bool *)&stack0xfffffffffffffdef,(char (*) [1])0x73e35c);
  return;
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) noexcept {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = appender(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    fmt::format_to(it, FMT_STRING("{}{}"), message, SEP);
  fmt::format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}